

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.hpp
# Opt level: O0

void boost::runtime::finalize_arguments(parameters_store *params,arguments_store *args)

{
  static_any_base *psVar1;
  undefined8 uVar2;
  bool bVar3;
  storage_type *psVar4;
  storage_type *psVar5;
  read_access_t pbVar6;
  type pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  parameters_store *in_RDI;
  basic_param_ptr param;
  value_type *v;
  bool _fe_con_33;
  static_any_t _fe_end_33;
  static_any_t _fe_cur_33;
  sp_counted_base *in_stack_fffffffffffffdb8;
  shared_ptr<boost::runtime::basic_param> *in_stack_fffffffffffffdc0;
  std_string *in_stack_fffffffffffffdc8;
  basic_cstring<const_char> *in_stack_fffffffffffffdd0;
  undefined5 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddd;
  byte in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  std_string *a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  sp_counted_base *this;
  byte local_1b9;
  std_string local_60;
  byte local_3c;
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>_>
  local_38;
  static_any_base *local_30;
  undefined1 local_20 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  parameters_store *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  psVar4 = parameters_store::all(in_RDI);
  psVar5 = parameters_store::all(local_8);
  unit_test::for_each::
  is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
            (psVar5);
  integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x2455fe);
  local_20._0_8_ =
       unit_test::for_each::
       begin<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                 (psVar4);
  local_20._8_8_ = local_20;
  bVar3 = unit_test::for_each::static_any_base::operator_cast_to_bool
                    ((static_any_base *)local_20._8_8_);
  if (!bVar3) {
    psVar4 = parameters_store::all(local_8);
    psVar5 = parameters_store::all(local_8);
    unit_test::for_each::
    is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
              (psVar5);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x245672);
    local_38._M_node =
         (_Base_ptr)
         unit_test::for_each::
         end<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                   (psVar4);
    local_30 = (static_any_base *)&local_38;
    bVar3 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_30);
    if (!bVar3) {
      local_3c = 1;
      while( true ) {
        uVar2 = local_20._8_8_;
        psVar1 = local_30;
        local_1b9 = 0;
        if ((local_3c & 1) != 0) {
          psVar4 = parameters_store::all(local_8);
          psVar5 = parameters_store::all(local_8);
          unit_test::for_each::
          is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                    (psVar5);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x24571b);
          bVar3 = unit_test::for_each::
                  done<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                            (uVar2,psVar1,psVar4);
          local_1b9 = bVar3 ^ 0xff;
        }
        if ((local_1b9 & 1) == 0) break;
        local_3c = 0;
        this = (sp_counted_base *)local_20._8_8_;
        psVar4 = parameters_store::all(local_8);
        psVar5 = parameters_store::all(local_8);
        unit_test::for_each::
        is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                  (psVar5);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x2457a1);
        local_60.field_2._8_8_ =
             unit_test::for_each::
             deref<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>const&,std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                       (this,psVar4);
        while (((local_3c ^ 0xff) & 1) != 0) {
          a0 = &local_60;
          shared_ptr<boost::runtime::basic_param>::shared_ptr
                    (in_stack_fffffffffffffdc0,
                     (shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffffdb8);
          val = local_10;
          shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
          unit_test::basic_cstring<const_char>::basic_cstring
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          bVar3 = arguments_store::has
                            ((arguments_store *)in_stack_fffffffffffffdd0,
                             (cstring *)in_stack_fffffffffffffdc8);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            pbVar7 = shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
            pbVar6 = unit_test::class_property::operator_cast_to_bool_
                               ((class_property *)&pbVar7->p_has_default_value);
            if ((*pbVar6 & 1U) != 0) {
              pbVar7 = shared_ptr<boost::runtime::basic_param>::operator->
                                 (in_stack_fffffffffffffdc0);
              (*pbVar7->_vptr_basic_param[4])(pbVar7,local_10);
            }
            shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
            unit_test::basic_cstring<const_char>::basic_cstring
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            bVar3 = arguments_store::has
                              ((arguments_store *)in_stack_fffffffffffffdd0,
                               (cstring *)in_stack_fffffffffffffdc8);
            if ((((bVar3 ^ 0xffU) & 1) != 0) &&
               (pbVar7 = shared_ptr<boost::runtime::basic_param>::operator->
                                   (in_stack_fffffffffffffdc0), (pbVar7->p_optional & 1U) == 0)) {
              shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
              unit_test::basic_cstring<const_char>::basic_cstring
                        (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
              missing_req_arg::missing_req_arg
                        ((missing_req_arg *)in_stack_fffffffffffffdd0,
                         (cstring *)in_stack_fffffffffffffdc8);
              specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
              operator<<((specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>
                          *)CONCAT17(in_stack_fffffffffffffddf,
                                     CONCAT16(in_stack_fffffffffffffdde,
                                              CONCAT15(in_stack_fffffffffffffddd,
                                                       in_stack_fffffffffffffdd8))),
                         (char *)in_stack_fffffffffffffdd0);
              shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
              specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error>::
              operator<<((specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>
                          *)this,val);
              specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
              operator<<((specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>
                          *)CONCAT17(in_stack_fffffffffffffddf,
                                     CONCAT16(in_stack_fffffffffffffdde,
                                              CONCAT15(in_stack_fffffffffffffddd,
                                                       in_stack_fffffffffffffdd8))),
                         (char *)in_stack_fffffffffffffdd0);
              unit_test::ut_detail::throw_exception<boost::runtime::missing_req_arg>
                        ((missing_req_arg *)in_stack_fffffffffffffdd0);
            }
          }
          shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
          unit_test::basic_cstring<const_char>::basic_cstring
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          in_stack_fffffffffffffddf =
               arguments_store::has
                         ((arguments_store *)in_stack_fffffffffffffdd0,
                          (cstring *)in_stack_fffffffffffffdc8);
          in_stack_fffffffffffffdde = 0;
          if ((bool)in_stack_fffffffffffffddf) {
            shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
            in_stack_fffffffffffffddd =
                 function1<void,_boost::unit_test::basic_cstring<const_char>_>::operator!
                           ((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)
                            0x245ad1);
            in_stack_fffffffffffffdde = in_stack_fffffffffffffddd ^ 0xff;
          }
          if ((in_stack_fffffffffffffdde & 1) != 0) {
            in_stack_fffffffffffffdc8 = &local_60;
            pbVar7 = shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
            in_stack_fffffffffffffdd0 = (basic_cstring<const_char> *)&pbVar7->p_callback;
            shared_ptr<boost::runtime::basic_param>::operator->(in_stack_fffffffffffffdc0);
            unit_test::basic_cstring<const_char>::basic_cstring
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            function1<void,_boost::unit_test::basic_cstring<const_char>_>::operator()
                      ((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)val,
                       (basic_cstring<const_char> *)a0);
          }
          shared_ptr<boost::runtime::basic_param>::~shared_ptr
                    ((shared_ptr<boost::runtime::basic_param> *)0x245b4b);
          local_3c = 1;
        }
        if ((local_3c & 1) == 0) {
          parameters_store::all(local_8);
        }
        else {
          in_stack_fffffffffffffdb8 = (sp_counted_base *)local_20._8_8_;
          in_stack_fffffffffffffdc0 =
               (shared_ptr<boost::runtime::basic_param> *)parameters_store::all(local_8);
          psVar4 = parameters_store::all(local_8);
          unit_test::for_each::
          is_const_coll<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>const>
                    (psVar4);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x245bb5);
          unit_test::for_each::
          next<std::map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>>
                    (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
        }
      }
    }
  }
  return;
}

Assistant:

inline void
finalize_arguments( parameters_store const& params, runtime::arguments_store& args )
{
    BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, params.all() ) {
        basic_param_ptr param = v.second;

        if( !args.has( param->p_name ) ) {
            if( param->p_has_default_value )
                param->produce_default( args );

            if( !args.has( param->p_name ) ) {
                BOOST_TEST_I_ASSRT( param->p_optional,
                    missing_req_arg( param->p_name ) << "Missing argument for required parameter " << param->p_name << "." );
            }
        }

        if( args.has( param->p_name ) && !!param->p_callback )
            param->p_callback( param->p_name );
    }
}